

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O2

void ncnn::gridsample_nearest_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  undefined4 uVar13;
  
  iVar8 = dst->h * dst->w * dst->d;
  pvVar1 = src->data;
  sVar2 = src->cstep;
  sVar3 = src->elemsize;
  pvVar11 = dst->data;
  sVar4 = dst->cstep;
  sVar5 = dst->elemsize;
  uVar10 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  pvVar6 = offset_value->data;
  uVar7 = (ulong)(uint)dst->c;
  if (dst->c < 1) {
    uVar7 = uVar10;
  }
  for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
      lVar12 = (long)*(int *)((long)pvVar6 + lVar9 * 4);
      if (lVar12 < 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(undefined4 *)((long)pvVar1 + lVar12 * 4 + sVar2 * sVar3 * uVar10);
      }
      *(undefined4 *)((long)pvVar11 + lVar9 * 4) = uVar13;
    }
    pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p1(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            *dstptr = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;

            offset_ptr++;
            dstptr++;
        }
    }
}